

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[65],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [65],
               DebugExpression<bool> *params_1,char (*params_2) [56],Exception *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  char (*params_00) [56];
  long lVar4;
  String *result;
  String argValues [4];
  String *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  String local_98;
  String local_80;
  String local_68 [2];
  
  str<char_const(&)[65]>
            (&local_98,(kj *)params,(char (*) [65])CONCAT44(in_register_00000014,severity));
  heapString(&local_80,5);
  if ((char *)local_80.content.size_ != (char *)0x0) {
    local_80.content.size_ = (size_t)local_80.content.ptr;
  }
  builtin_strncpy((char *)local_80.content.size_,"false",5);
  str<char_const(&)[56]>(local_68,(kj *)params_2,params_00);
  kj::operator*(&stack0xffffffffffffff50,params_3);
  argValues_00.size_ = in_stack_ffffffffffffff50;
  argValues_00.ptr = in_stack_ffffffffffffff48;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_98,argValues_00);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}